

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O2

void __thiscall
rate_adaptive_code_from_colptr_rowIdx_llrs_bsc_Test::
~rate_adaptive_code_from_colptr_rowIdx_llrs_bsc_Test
          (rate_adaptive_code_from_colptr_rowIdx_llrs_bsc_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(rate_adaptive_code_from_colptr_rowIdx, llrs_bsc) {
    std::vector<bool> x{1, 1, 1, 1, 0, 0, 0};
    double p = 0.01;

    double vlog = log((1 - p) / p);
    std::vector<double> llrs(x.size());
    for (std::size_t i{}; i < llrs.size(); ++i) {
        llrs[i] = vlog * (1 - 2 * x[i]); // log likelihood ratios
    }

    std::vector<double> llrs_convenience = LDPC4QKD::llrs_bsc(x, p);

    EXPECT_EQ(llrs_convenience, llrs);
}